

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::~IfcRelContainedInSpatialStructure
          (IfcRelContainedInSpatialStructure *this)

{
  void *pvVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRelContainedInSpatialStructure_0081c500;
  *(undefined ***)&this->field_0xd8 = &PTR__IfcRelContainedInSpatialStructure_0081c5a0;
  *(undefined ***)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x88 =
       &PTR__IfcRelContainedInSpatialStructure_0081c528;
  *(undefined ***)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x98 =
       &PTR__IfcRelContainedInSpatialStructure_0081c550;
  *(undefined ***)&(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8 =
       &PTR__IfcRelContainedInSpatialStructure_0081c578;
  pvVar1 = *(void **)&(this->super_IfcRelConnects).field_0xb8;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x81c790;
  *(undefined8 *)&this->field_0xd8 = 0x81c7b8;
  pcVar2 = (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.Description.ptr.
           _M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 !=
      &(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.Description.ptr.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.Name.ptr._M_dataplus.
           _M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 !=
      &(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.Name.ptr.field_2) {
    operator_delete(pcVar2);
  }
  puVar3 = *(undefined1 **)
            &(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10;
  if (puVar3 != &(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x20) {
    operator_delete(puVar3);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcRelContainedInSpatialStructure() : Object("IfcRelContainedInSpatialStructure") {}